

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O2

wchar_t scatter_ext(chunk_conflict *c,loc *places,wchar_t n,loc grid,wchar_t d,_Bool need_los,
                   _func__Bool_chunk_ptr_loc *pred)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  uint32_t uVar6;
  void *p;
  loc grid_00;
  long lVar7;
  wchar_t wVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar9 = 0;
  wVar4 = L'\0';
  if (L'\0' < d) {
    wVar4 = d;
  }
  iVar1 = wVar4 * 2 + 1;
  iVar3 = c->width;
  if (iVar1 <= c->width) {
    iVar3 = iVar1;
  }
  if (c->height < iVar1) {
    iVar1 = c->height;
  }
  p = mem_alloc((long)iVar1 * (long)iVar3 * 8);
  for (wVar4 = grid.y - d; wVar8 = grid.x - d, wVar4 <= grid.y + d; wVar4 = wVar4 + L'\x01') {
    for (; wVar8 <= grid.x + d; wVar8 = wVar8 + L'\x01') {
      grid_00.y = wVar4;
      grid_00.x = wVar8;
      _Var2 = square_in_bounds_fully(c,grid_00);
      if ((((_Var2) &&
           ((d < L'\x02' || (wVar5 = distance((loc_conflict)grid,(loc_conflict)grid_00), wVar5 <= d)
            ))) && ((!need_los || (_Var2 = los(c,(loc_conflict)grid,(loc_conflict)grid_00), _Var2)))
          ) && ((pred == (_func__Bool_chunk_ptr_loc *)0x0 || (_Var2 = (*pred)(c,grid_00), _Var2))))
      {
        *(wchar_t *)((long)p + (long)(int)uVar9 * 8) = wVar8;
        *(wchar_t *)((long)p + (long)(int)uVar9 * 8 + 4) = wVar4;
        uVar9 = uVar9 + 1;
      }
    }
  }
  lVar7 = 0;
  for (uVar10 = (ulong)uVar9; (lVar7 < n && (0 < (int)(uint32_t)uVar10)); uVar10 = uVar10 - 1) {
    uVar6 = Rand_div((uint32_t)uVar10);
    places[lVar7] = *(loc *)((long)p + (long)(int)uVar6 * 8);
    lVar7 = lVar7 + 1;
    *(undefined8 *)((long)p + (long)(int)uVar6 * 8) = *(undefined8 *)((long)p + uVar10 * 8 + -8);
  }
  mem_free(p);
  return (wchar_t)lVar7;
}

Assistant:

int scatter_ext(struct chunk *c, struct loc *places, int n, struct loc grid,
		int d, bool need_los, bool (*pred)(struct chunk *, struct loc))
{
	int result = 0;
	/* Stores feasible locations. */
	struct loc *feas = mem_alloc(MIN(c->width, (1 + 2 * MAX(0, d)))
			* (size_t) MIN(c->height, (1 + 2 * MAX(0, d)))
			* sizeof(*feas));
	int nfeas = 0;
	struct loc g;

	/* Get the feasible locations. */
	for (g.y = grid.y - d; g.y <= grid.y + d; ++g.y) {
		for (g.x = grid.x - d; g.x <= grid.x + d; ++g.x) {
			if (!square_in_bounds_fully(c, g)) continue;
			if (d > 1 && distance(grid, g) > d) continue;
			if (need_los && !los(c, grid, g)) continue;
			if (pred && !(*pred)(c, g)) continue;
			feas[nfeas] = g;
			++nfeas;
		}
	}

	/* Assemble the result. */
	while (result < n && nfeas > 0) {
		/* Choose one at random and append it to the outgoing list. */
		int choice = randint0(nfeas);

		places[result] = feas[choice];
		++result;
		/* Shift the last feasible one to replace the one selected. */
		--nfeas;
		feas[choice] = feas[nfeas];
	}

	mem_free(feas);
	return result;
}